

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

Connection * __thiscall
soul::PoolAllocator::
allocate<soul::AST::Connection,soul::AST::Context&,soul::InterpolationType&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ref<soul::AST::Connection::SharedEndpoint>&,soul::pool_ptr<soul::AST::Expression>&>
          (PoolAllocator *this,Context *args,InterpolationType *args_1,
          pool_ref<soul::AST::Connection::SharedEndpoint> *args_2,
          pool_ref<soul::AST::Connection::SharedEndpoint> *args_3,
          pool_ptr<soul::AST::Expression> *args_4)

{
  PoolItem *pPVar1;
  pool_ptr<soul::AST::Expression> local_38;
  
  pPVar1 = allocateSpaceForObject(this,0x48);
  local_38 = (pool_ptr<soul::AST::Expression>)args_4->object;
  AST::Connection::Connection
            ((Connection *)&pPVar1->item,args,*args_1,args_2->object,args_3->object,&local_38);
  pPVar1->destructor =
       allocate<soul::AST::Connection,_soul::AST::Context_&,_soul::InterpolationType_&,_soul::pool_ref<soul::AST::Connection::SharedEndpoint>_&,_soul::pool_ref<soul::AST::Connection::SharedEndpoint>_&,_soul::pool_ptr<soul::AST::Expression>_&>
       ::anon_class_1_0_00000001::__invoke;
  return (Connection *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }